

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenUnionCreatorForString
          (PythonGenerator *this,EnumDef *enum_def,EnumVal *ev,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string variant;
  string union_type;
  
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&union_type,&this->namer_,enum_def);
  (*(this->namer_).super_Namer._vptr_Namer[0x13])(&variant,&this->namer_,ev);
  GenIndents_abi_cxx11_(&local_e0,this,1);
  std::operator+(&local_c0,&local_e0,"if unionType == ");
  std::operator+(&local_a0,&local_c0,&union_type);
  std::operator+(&local_80,&local_a0,"().");
  std::operator+(&local_120,&local_80,&variant);
  std::operator+(&local_100,&local_120,":");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  GenIndents_abi_cxx11_(&local_120,this,2);
  std::operator+(&local_100,&local_120,"tab = Table(table.Bytes, table.Pos)");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  GenIndents_abi_cxx11_(&local_120,this,2);
  std::operator+(&local_100,&local_120,"union = tab.String(table.Pos)");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  GenIndents_abi_cxx11_(&local_120,this,2);
  std::operator+(&local_100,&local_120,"return union");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&variant);
  std::__cxx11::string::~string((string *)&union_type);
  return;
}

Assistant:

void GenUnionCreatorForString(const EnumDef &enum_def, const EnumVal &ev,
                                std::string *code_ptr) const {
    auto &code = *code_ptr;
    const auto union_type = namer_.Type(enum_def);
    const auto variant = namer_.Variant(ev);

    code +=
        GenIndents(1) + "if unionType == " + union_type + "()." + variant + ":";
    code += GenIndents(2) + "tab = Table(table.Bytes, table.Pos)";
    code += GenIndents(2) + "union = tab.String(table.Pos)";
    code += GenIndents(2) + "return union";
  }